

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

vec<3,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar5;
  char cVar6;
  char cVar7;
  CanonicalDataSource CVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  pointer pvVar13;
  ulong uVar14;
  size_t sVar15;
  element_type *buff;
  ulong uVar16;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  uvec3 uVar19;
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar20;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  undefined8 uVar21;
  anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7 aVar22;
  
  if (this->deviceBufferType - Texture1d < 3) {
    ensureHostBufferPopulated(this);
  }
  CVar8 = currentCanonicalDataSource(this);
  if (CVar8 != RenderBuffer) {
    if (CVar8 == NeedsCompute) {
      if ((this->computeFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->computeFunc)._M_invoker)((_Any_data *)&this->computeFunc);
      pvVar13 = (this->data->
                super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 2) *
               -0x5555555555555555;
      if (ind <= uVar14 && uVar14 - ind != 0) goto LAB_00226157;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      puVar11 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar11) {
        local_b8 = *puVar11;
        lStack_b0 = puVar10[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar11;
        local_c8 = (ulong *)*puVar10;
      }
      local_c0 = puVar10[1];
      *puVar10 = puVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      cVar7 = '\x01';
      if (9 < ind) {
        sVar15 = ind;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (sVar15 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00225fc2;
          }
          if (sVar15 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00225fc2;
          }
          if (sVar15 < 10000) goto LAB_00225fc2;
          bVar4 = 99999 < sVar15;
          sVar15 = sVar15 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar4);
        cVar7 = cVar7 + '\x01';
      }
LAB_00225fc2:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar14 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar16 = 0xf;
      if (local_c8 != &local_b8) {
        uVar16 = local_b8;
      }
      if (uVar16 < uVar14) {
        uVar16 = 0xf;
        if (local_e8 != local_d8) {
          uVar16 = local_d8[0];
        }
        if (uVar16 < uVar14) goto LAB_0022602b;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_0022602b:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar10 + 2;
      if ((undefined8 *)*puVar10 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar10[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar10;
      }
      local_100 = puVar10[1];
      *puVar10 = puVar1;
      puVar10[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar18 = &local_68.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_68.field_2._M_allocated_capacity = *psVar12;
        local_68.field_2._8_8_ = plVar9[3];
        local_68._M_dataplus._M_p = (pointer)paVar18;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar12;
        local_68._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_68._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      exception(&local_68);
      _Var17._M_p = local_68._M_dataplus._M_p;
    }
    else {
      if (CVar8 != HostData) {
        return (vec<3,_unsigned_int,_(glm::qualifier)0>)ZEXT812(0);
      }
      pvVar13 = (this->data->
                super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->data->
                      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 2) *
               -0x5555555555555555;
      if (ind <= uVar14 && uVar14 - ind != 0) goto LAB_00226157;
      std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_a8);
      puVar11 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar11) {
        local_b8 = *puVar11;
        lStack_b0 = plVar9[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar11;
        local_c8 = (ulong *)*plVar9;
      }
      local_c0 = plVar9[1];
      *plVar9 = (long)puVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      cVar7 = '\x01';
      if (9 < ind) {
        sVar15 = ind;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (sVar15 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00225e7b;
          }
          if (sVar15 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00225e7b;
          }
          if (sVar15 < 10000) goto LAB_00225e7b;
          bVar4 = 99999 < sVar15;
          sVar15 = sVar15 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar4);
        cVar7 = cVar7 + '\x01';
      }
LAB_00225e7b:
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct((ulong)&local_e8,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
      uVar14 = CONCAT44(uStack_dc,local_e0) + local_c0;
      uVar16 = 0xf;
      if (local_c8 != &local_b8) {
        uVar16 = local_b8;
      }
      if (uVar16 < uVar14) {
        uVar16 = 0xf;
        if (local_e8 != local_d8) {
          uVar16 = local_d8[0];
        }
        if (uVar16 < uVar14) goto LAB_00225ee4;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      }
      else {
LAB_00225ee4:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
      }
      local_108 = &local_f8;
      puVar1 = puVar10 + 2;
      if ((undefined8 *)*puVar10 == puVar1) {
        local_f8 = *puVar1;
        uStack_f0 = puVar10[3];
      }
      else {
        local_f8 = *puVar1;
        local_108 = (undefined8 *)*puVar10;
      }
      local_100 = puVar10[1];
      *puVar10 = puVar1;
      puVar10[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
      paVar18 = &local_48.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_48.field_2._M_allocated_capacity = *psVar12;
        local_48.field_2._8_8_ = plVar9[3];
        local_48._M_dataplus._M_p = (pointer)paVar18;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar12;
        local_48._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_48._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      exception(&local_48);
      _Var17._M_p = local_48._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != paVar18) {
      operator_delete(_Var17._M_p);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    pvVar13 = (this->data->
              super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
LAB_00226157:
    uVar2 = pvVar13[ind].field_0;
    uVar3 = pvVar13[ind].field_1;
    vVar5.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_unsigned_int,_(glm::qualifier)0>_5)uVar3;
    vVar5.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_unsigned_int,_(glm::qualifier)0>_3)uVar2;
    vVar5.field_2.z = pvVar13[ind].field_2.z;
    return vVar5;
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((long)ind < buff->dataSize) goto LAB_00225e6c;
  std::operator+(&local_a8,"out of bounds access in ManagedBuffer ",&this->name);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar11) {
    local_b8 = *puVar11;
    lStack_b0 = plVar9[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar11;
    local_c8 = (ulong *)*plVar9;
  }
  local_c0 = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  cVar7 = '\x01';
  if (9 < ind) {
    sVar15 = ind;
    cVar6 = '\x04';
    do {
      cVar7 = cVar6;
      if (sVar15 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00225cda;
      }
      if (sVar15 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00225cda;
      }
      if (sVar15 < 10000) goto LAB_00225cda;
      bVar4 = 99999 < sVar15;
      sVar15 = sVar15 / 10000;
      cVar6 = cVar7 + '\x04';
    } while (bVar4);
    cVar7 = cVar7 + '\x01';
  }
LAB_00225cda:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,ind);
  uVar14 = CONCAT44(uStack_dc,local_e0) + local_c0;
  uVar16 = 0xf;
  if (local_c8 != &local_b8) {
    uVar16 = local_b8;
  }
  if (uVar16 < uVar14) {
    uVar16 = 0xf;
    if (local_e8 != local_d8) {
      uVar16 = local_d8[0];
    }
    if (uVar16 < uVar14) goto LAB_00225d43;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00225d43:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
  }
  local_108 = &local_f8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar10[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar10;
  }
  local_100 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88.field_2._8_8_ = plVar9[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_88._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  exception(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  buff = (this->renderAttributeBuffer).
         super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00225e6c:
  uVar19 = getAttributeBufferData<glm::vec<3,unsigned_int,(glm::qualifier)0>>(buff,ind);
  vVar20.field_0 = uVar19.field_0;
  uVar21._4_4_ = uVar19.field_1;
  register0x00000010 = uVar19.field_2;
  return vVar20;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}